

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O1

int __thiscall Function::init(Function *this,EVP_PKEY_CTX *ctx)

{
  this->oLog = (ostream *)&std::cout;
  this->xSrc = (double *)0x0;
  this->xLeft = (Function *)0x0;
  this->xRight = (Function *)0x0;
  this->xPlus = (Function *)0x0;
  this->xTable = (Matrix *)0x0;
  this->xFunction = 0;
  *(undefined8 *)&this->field_0xd0 = 0;
  this->dValue = 0.0;
  this->dLastValue = 0.0;
  this->dXMin = -10.0;
  this->dXMax = 10.0;
  this->dXStep = 0.1;
  this->dYMin = -10.0;
  this->dYMax = 10.0;
  this->dYStep = 0.1;
  this->bValueValid = false;
  this->bVerbose = false;
  this->functionUseCount = 0;
  this->eType = EMPTY;
  this->dXInput = 0.0;
  this->dNextXInput = 0.0;
  this->dYInput = 0.0;
  this->dNextYInput = 0.0;
  return 0;
}

Assistant:

void Function::init()
{
	oLog = &cout;
	eType = EMPTY;
	xSrc = 0;
	xLeft = 0;
	xRight = 0;
	xPlus = 0;
	xTable = 0;
	xFunction = 0;
	dValue = 0.0;
	dLastValue = 0.0;
	dXMin = -10.0;
	dXMax = 10.0;
	dXStep = 0.1;
	dYMin = -10.0;
	dYMax = 10.0;
	dYStep = 0.1;
	dXInput = 0.0;
	dNextXInput = 0.0;
	dYInput = 0.0;
	dNextYInput = 0.0;
	bValueValid = false;
	bVerbose = false;
	functionUseCount = 0;
}